

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O3

void __thiscall
myvk::CommandBuffer::CmdBlitImage
          (CommandBuffer *this,Ptr<ImageView> *src_view,Ptr<ImageView> *dst_view,VkFilter filter)

{
  VkImageAspectFlags VVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  element_type *peVar5;
  element_type *peVar6;
  uint uVar7;
  byte bVar8;
  long lVar9;
  element_type *peVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  VkImageBlit *pVVar14;
  pointer pVVar15;
  element_type *peVar16;
  byte bVar17;
  vector<VkImageBlit,_std::allocator<VkImageBlit>_> blits;
  VkImageBlit local_98;
  uint32_t local_48;
  uint32_t uStack_44;
  undefined8 uStack_40;
  
  bVar17 = 0;
  blits.super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  blits.super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  blits.super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar5 = (src_view->super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar6 = (dst_view->super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar16 = (peVar5->m_image_ptr).super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  peVar10 = (peVar6->m_image_ptr).super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  uVar12 = (peVar5->m_subresource_range).baseMipLevel;
  if (uVar12 < (peVar5->m_subresource_range).levelCount + uVar12) {
    VVar1 = (peVar6->m_subresource_range).aspectMask;
    local_48 = (peVar6->m_subresource_range).baseArrayLayer;
    uStack_44 = (peVar6->m_subresource_range).layerCount;
    uStack_40 = 0;
    uVar2 = (peVar10->m_extent).width;
    uVar3 = (peVar10->m_extent).height;
    uVar4 = (peVar10->m_extent).depth;
    do {
      local_98.dstOffsets[0].x = 0;
      local_98.dstOffsets[0].y = 0;
      local_98.srcOffsets[0].x = 0;
      local_98.srcOffsets[0].y = 0;
      local_98.dstOffsets[0].z = 0;
      local_98.srcSubresource.aspectMask = (peVar5->m_subresource_range).aspectMask;
      local_98.srcSubresource.mipLevel = uVar12;
      local_98.srcSubresource.baseArrayLayer = (peVar5->m_subresource_range).baseArrayLayer;
      local_98.srcSubresource.layerCount = (peVar5->m_subresource_range).layerCount;
      local_98.dstSubresource.mipLevel = uVar12;
      local_98.dstSubresource.aspectMask = VVar1;
      local_98.dstSubresource.baseArrayLayer = local_48;
      local_98.dstSubresource.layerCount = uStack_44;
      bVar8 = (byte)uVar12;
      uVar7 = (peVar16->m_extent).width >> (bVar8 & 0x1f);
      uVar11 = (peVar16->m_extent).height >> (bVar8 & 0x1f);
      uVar13 = (peVar16->m_extent).depth >> (bVar8 & 0x1f);
      local_98.srcOffsets._8_8_ = (ulong)(uVar7 + (uVar7 == 0)) << 0x20;
      local_98.srcOffsets[1].z = uVar13 + (uVar13 == 0);
      local_98.srcOffsets[1].y = uVar11 + (uVar11 == 0);
      uVar7 = uVar2 >> (bVar8 & 0x1f);
      uVar11 = uVar3 >> (bVar8 & 0x1f);
      uVar13 = uVar4 >> (bVar8 & 0x1f);
      local_98.dstOffsets[1].x = uVar7 + (uVar7 == 0);
      local_98.dstOffsets[1].y = uVar11 + (uVar11 == 0);
      local_98.dstOffsets[1].z = uVar13 + (uVar13 == 0);
      if (blits.super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          blits.super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<VkImageBlit,std::allocator<VkImageBlit>>::_M_realloc_insert<VkImageBlit_const&>
                  ((vector<VkImageBlit,std::allocator<VkImageBlit>> *)&blits,
                   (iterator)
                   blits.super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_98);
      }
      else {
        pVVar14 = &local_98;
        pVVar15 = blits.super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (lVar9 = 0x14; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pVVar15->srcSubresource).aspectMask = (pVVar14->srcSubresource).aspectMask;
          pVVar14 = (VkImageBlit *)((long)pVVar14 + (ulong)bVar17 * -8 + 4);
          pVVar15 = (pointer)((long)pVVar15 + (ulong)bVar17 * -8 + 4);
        }
        blits.super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>._M_impl.
        super__Vector_impl_data._M_finish =
             blits.super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (peVar5->m_subresource_range).levelCount +
                      (peVar5->m_subresource_range).baseMipLevel);
    peVar16 = (((src_view->super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->m_image_ptr).super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar10 = (((dst_view->super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->m_image_ptr).super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  (*vkCmdBlitImage)(this->m_command_buffer,peVar16->m_image,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                    peVar10->m_image,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
                    (int)((ulong)((long)blits.
                                        super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)blits.
                                       super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                    -0x33333333,
                    blits.super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>._M_impl.
                    super__Vector_impl_data._M_start,filter);
  if (blits.super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(blits.super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)blits.super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)blits.super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CommandBuffer::CmdBlitImage(const Ptr<ImageView> &src_view, const Ptr<ImageView> &dst_view,
                                 VkFilter filter) const {
	std::vector<VkImageBlit> blits;
	const auto &src_subres = src_view->GetSubresourceRange(), dst_subres = dst_view->GetSubresourceRange();
	const auto &src_extent = src_view->GetImagePtr()->GetExtent(), dst_extent = dst_view->GetImagePtr()->GetExtent();
	for (uint32_t i = src_subres.baseMipLevel; i < src_subres.baseMipLevel + src_subres.levelCount; ++i) {
		VkImageBlit blit = {};
		blit.srcSubresource = {src_subres.aspectMask, i, src_subres.baseArrayLayer, src_subres.layerCount};
		blit.dstSubresource = {dst_subres.aspectMask, i, dst_subres.baseArrayLayer, dst_subres.layerCount};
		blit.srcOffsets[1] = {
		    (int32_t)std::max(1u, src_extent.width >> i),
		    (int32_t)std::max(1u, src_extent.height >> i),
		    (int32_t)std::max(1u, src_extent.depth >> i),
		};
		blit.dstOffsets[1] = {
		    (int32_t)std::max(1u, dst_extent.width >> i),
		    (int32_t)std::max(1u, dst_extent.height >> i),
		    (int32_t)std::max(1u, dst_extent.depth >> i),
		};
		blits.push_back(blit);
	}
	vkCmdBlitImage(m_command_buffer, src_view->GetImagePtr()->GetHandle(), VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
	               dst_view->GetImagePtr()->GetHandle(), VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, blits.size(),
	               blits.data(), filter);
}